

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream * QtPrivate::readArrayBasedContainer<QList<QVariant>>(QDataStream *s,QList<QVariant> *c)

{
  Status SVar1;
  qint64 asize;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_68,s);
  QList<QVariant>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus(s,SizeLimitExceeded);
  }
  else {
    QList<QVariant>::reserve(c,asize);
    lVar2 = asize + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) break;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      ::operator>>(s,(QVariant *)&local_58);
      SVar1 = QDataStream::status(s);
      if (SVar1 == Ok) {
        QList<QVariant>::emplaceBack<QVariant_const&>(c,(QVariant *)&local_58);
      }
      else {
        QList<QVariant>::clear(c);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    } while (SVar1 == Ok);
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}